

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int AnalyseBufWithMIDSeanet(uchar *buf,int buflen,int mid)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 1;
  if ((10 < buflen) && (*buf == '@')) {
    uVar1 = GetHexLengthSeanet(buf);
    if ((uVar1 == *(ushort *)(buf + 5)) && (uVar1 + 6 <= (uint)buflen && buf[10] == (uchar)mid)) {
      uVar2 = (uint)(buf[(ulong)uVar1 + 5] != '\n');
    }
  }
  return uVar2;
}

Assistant:

inline int AnalyseBufWithMIDSeanet(unsigned char* buf, int buflen, int mid)
{
	int HexLength = 0;

	if (buflen < MIN_MESSAGE_LEN_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid number of bytes\n"));
		return EXIT_FAILURE;
	}
	if (buf[0] != MESSAGE_HEADER_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message header\n"));
		return EXIT_FAILURE;
	}
	HexLength = GetHexLengthSeanet(buf);
	if (HexLength != GetBinLengthSeanet(buf))
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid Hex or Bin Length\n"));
		return EXIT_FAILURE;
	}
	if (buf[10] != (unsigned char)mid)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message ID\n"));
		return EXIT_FAILURE;
	}
	if (buflen < HexLength+6)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Incomplete message\n"));
		return EXIT_FAILURE;
	}
	if (buf[HexLength+5] != MESSAGE_TERMINATOR_SEANET)
	{ 
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message terminator\n"));
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}